

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_jumps.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5fb9d::ir_lower_jumps_visitor::visit(ir_lower_jumps_visitor *this,ir_discard *ir)

{
  return;
}

Assistant:

virtual void visit(class ir_discard * ir)
   {
      /* Nothing needs to be done.  The ANALYSIS and
       * DEAD_CODE_ELIMINATION postconditions are already satisfied,
       * because discard statements are ignored by this optimization
       * pass.  The CONTAINED_JUMPS_LOWERED postcondition is already
       * satisfied, because discard statements can't contain other
       * statements.
       */
      (void) ir;
   }